

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void writeBits(LodePNGBitWriter *writer,uint value,size_t nbits)

{
  long lVar1;
  long in_RDX;
  uint in_ESI;
  long *in_RDI;
  size_t i;
  ucvector *in_stack_ffffffffffffffd8;
  long local_20;
  
  if (in_RDX == 1) {
    if ((in_RDI[1] & 7U) == 0) {
      ucvector_push_back(in_stack_ffffffffffffffd8,'\0');
    }
    lVar1 = *(long *)(*in_RDI + 8) + -1;
    *(byte *)(*(long *)*in_RDI + lVar1) =
         *(byte *)(*(long *)*in_RDI + lVar1) | (byte)(in_ESI << ((byte)in_RDI[1] & 7));
    in_RDI[1] = in_RDI[1] + 1;
  }
  else {
    for (local_20 = 0; local_20 != in_RDX; local_20 = local_20 + 1) {
      if ((in_RDI[1] & 7U) == 0) {
        ucvector_push_back(in_stack_ffffffffffffffd8,'\0');
      }
      lVar1 = *(long *)(*in_RDI + 8) + -1;
      *(byte *)(*(long *)*in_RDI + lVar1) =
           *(byte *)(*(long *)*in_RDI + lVar1) |
           (byte)((in_ESI >> ((byte)local_20 & 0x1f) & 1) << ((byte)in_RDI[1] & 7));
      in_RDI[1] = in_RDI[1] + 1;
    }
  }
  return;
}

Assistant:

static void writeBits(LodePNGBitWriter* writer, unsigned value, size_t nbits) {
  if(nbits == 1) { /* compiler should statically compile this case if nbits == 1 */
    WRITEBIT(writer, value);
  } else {
    /* TODO: increase output size nly once here rather than in each WRITEBIT */
    size_t i;
    for(i = 0; i != nbits; ++i) {
      WRITEBIT(writer, (unsigned char)((value >> i) & 1));
    }
  }
}